

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O1

bool basisu::unpack_bc7_mode0_2(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  ulong uVar1;
  undefined4 *puVar2;
  uint32_t bits;
  uint uVar3;
  uint uVar4;
  sbyte sVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  uint32_t total_bits;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint32_t total_bits_1;
  undefined1 *puVar17;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar18;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar19;
  uint32_t c;
  long lVar20;
  ulong uVar21;
  uint32_t i;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  color_rgba endpoints [6];
  uint32_t pbits [6];
  color_rgba block_colors [3] [8];
  uint32_t weights [16];
  undefined1 local_118 [32];
  uint auStack_f8 [8];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_d8 [24];
  uint auStack_78 [18];
  
  bVar25 = mode == 0;
  uVar7 = mode + 1;
  if (0x20 < uVar7) {
    __assert_fail("codesize <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                  ,0x71,"uint32_t basisu::read_bits32(const uint8_t *, uint32_t &, uint32_t)");
  }
  if (uVar7 == 0) {
    uVar12 = 0;
    uVar22 = 0;
  }
  else {
    uVar22 = 0;
    uVar3 = 0;
    uVar12 = 0;
    do {
      iVar13 = 8 - (uVar12 & 7);
      if ((int)(uVar7 - uVar3) < iVar13) {
        iVar13 = uVar7 - uVar3;
      }
      uVar22 = uVar22 | (~(-1 << ((byte)iVar13 & 0x1f)) &
                        (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >>
                              (sbyte)(uVar12 & 7))) << ((byte)uVar3 & 0x1f);
      uVar3 = uVar3 + iVar13;
      uVar12 = uVar12 + iVar13;
    } while (uVar3 < uVar7);
  }
  uVar7 = 1 << ((byte)mode & 0x1f);
  if (uVar22 == uVar7) {
    uVar3 = bVar25 + 2;
    uVar11 = bVar25 ^ 5;
    uVar6 = (uint)(mode != 0) * 2 + 4;
    uVar21 = 0;
    uVar14 = 0;
    do {
      iVar8 = uVar6 - uVar14;
      iVar13 = 8 - (uVar12 & 7);
      if (iVar8 < iVar13) {
        iVar13 = iVar8;
      }
      uVar4 = (uint)uVar21 |
              (~(-1 << ((byte)iVar13 & 0x1f)) &
              (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >> (sbyte)(uVar12 & 7))) <<
              ((byte)uVar14 & 0x1f);
      uVar21 = (ulong)uVar4;
      uVar14 = uVar14 + iVar13;
      uVar12 = iVar13 + uVar12;
    } while (uVar14 < uVar6);
    lVar20 = 0;
    do {
      lVar9 = 0;
      do {
        uVar6 = 0;
        uVar14 = 0;
        do {
          uVar16 = uVar12;
          uVar15 = uVar16 & 7;
          iVar8 = uVar11 - uVar14;
          iVar13 = 8 - uVar15;
          if (iVar8 < (int)(8 - uVar15)) {
            iVar13 = iVar8;
          }
          uVar6 = uVar6 | (~(-1 << ((byte)iVar13 & 0x1f)) &
                          (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar16 >> 3)) >>
                                (sbyte)uVar15)) << ((byte)uVar14 & 0x1f);
          uVar14 = uVar14 + iVar13;
          uVar12 = iVar13 + uVar16;
        } while (uVar14 < uVar11);
        *(char *)((long)auStack_f8 + lVar9 * 4 + lVar20 + -0x20) = (char)uVar6;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 6);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    if (mode == 0) {
      iVar13 = 8 - uVar15;
      if (iVar8 < (int)(8 - uVar15)) {
        iVar13 = iVar8;
      }
      uVar23 = 0;
      do {
        uVar12 = iVar13 + uVar16 + (int)uVar23;
        uVar1 = uVar23 + 1;
        auStack_f8[uVar23] =
             (uint)((*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >> (uVar12 & 7) & 1) != 0);
        bVar24 = uVar23 < 5;
        uVar23 = uVar1;
      } while (bVar24);
      iVar13 = 8 - uVar15;
      if (iVar8 < (int)(8 - uVar15)) {
        iVar13 = iVar8;
      }
      uVar12 = uVar16 + (int)uVar1 + iVar13;
    }
    uVar23 = 0;
    do {
      if (((uVar23 == 0) ||
          (uVar23 == (byte)basist::g_bc7_table_anchor_index_third_subset_1[uVar21])) ||
         (uVar6 = uVar3, uVar23 == (byte)basist::g_bc7_table_anchor_index_third_subset_2[uVar21])) {
        uVar6 = bVar25 + 1;
      }
      uVar14 = 0;
      uVar16 = 0;
      do {
        iVar13 = 8 - (uVar12 & 7);
        if ((int)(uVar6 - uVar16) < iVar13) {
          iVar13 = uVar6 - uVar16;
        }
        uVar14 = uVar14 | (~(-1 << ((byte)iVar13 & 0x1f)) &
                          (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >>
                                (sbyte)(uVar12 & 7))) << ((byte)uVar16 & 0x1f);
        uVar16 = uVar16 + iVar13;
        uVar12 = iVar13 + uVar12;
      } while (uVar16 < uVar6);
      auStack_78[uVar23] = uVar14;
      uVar23 = uVar23 + 1;
    } while (uVar23 != 0x10);
    if (uVar12 != 0x80) {
      __assert_fail("bit_offset == 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                    ,0x1e2,"bool basisu::unpack_bc7_mode0_2(uint32_t, const void *, color_rgba *)");
    }
    sVar5 = (sbyte)uVar11;
    puVar17 = local_118;
    lVar20 = 0;
    do {
      lVar9 = 0;
      do {
        uVar12 = 0xff;
        if (lVar9 != 3) {
          if (mode == 0) {
            if ((byte)puVar17[lVar9] >> sVar5 != 0) {
              pcVar10 = "val < (1U << val_bits)";
LAB_0024bc9e:
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                            ,0x1b0,"uint32_t basisu::bc7_dequant(uint32_t, uint32_t, uint32_t)");
            }
            if (1 < auStack_f8[lVar20]) {
              pcVar10 = "pbit < 2";
              goto LAB_0024bc9e;
            }
            uVar12 = auStack_f8[lVar20] + (uint)(byte)puVar17[lVar9] * 2 << (bVar25 ^ 2U);
            uVar12 = uVar12 >> sVar5 + 1 | uVar12;
            if (0xff < uVar12) {
              pcVar10 = "val <= 255";
              goto LAB_0024bc9e;
            }
          }
          else {
            if ((byte)puVar17[lVar9] >> sVar5 != 0) {
              pcVar10 = "val < (1U << val_bits)";
LAB_0024bc6d:
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                            ,0x1b1,"uint32_t basisu::bc7_dequant(uint32_t, uint32_t)");
            }
            uVar12 = (uint)(byte)puVar17[lVar9] << (8U - sVar5 & 0x1f);
            uVar12 = uVar12 >> sVar5 | uVar12;
            if (0xff < uVar12) {
              pcVar10 = "val <= 255";
              goto LAB_0024bc6d;
            }
          }
        }
        puVar17[lVar9] = (char)uVar12;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      lVar20 = lVar20 + 1;
      puVar17 = puVar17 + 4;
    } while (lVar20 != 6);
    paVar19 = local_d8;
    puVar17 = local_118 + 4;
    lVar20 = 0;
    do {
      uVar21 = 0;
      paVar18 = paVar19;
      do {
        lVar9 = 0;
        do {
          if (mode == 0) {
            puVar2 = &basist::g_bc7_weights3;
            if (7 < uVar21) {
              __assert_fail("w < 8",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                            ,0x1b4,"uint32_t basisu::bc7_interp3(uint32_t, uint32_t, uint32_t)");
            }
          }
          else {
            puVar2 = &basist::g_bc7_weights2;
            if (3 < uVar21) {
              __assert_fail("w < 4",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                            ,0x1b3,"uint32_t basisu::bc7_interp2(uint32_t, uint32_t, uint32_t)");
            }
          }
          paVar18->m_comps[lVar9] =
               (uint8_t)((0x40 - puVar2[uVar21]) * (uint)(byte)puVar17[lVar9 + -4] +
                         (uint)(byte)puVar17[lVar9] * puVar2[uVar21] + 0x20 >> 6);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        local_d8[0].m_comps[uVar21 * 4 + lVar20 * 0x20 + 3] = 0xff;
        uVar21 = uVar21 + 1;
        sVar5 = (sbyte)uVar3;
        paVar18 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar18->m_comps + 4);
      } while ((uint)uVar21 >> sVar5 == 0);
      lVar20 = lVar20 + 1;
      puVar17 = puVar17 + 8;
      paVar19 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar19->m_comps + 0x20);
    } while (lVar20 != 3);
    uVar21 = (ulong)(0 >> sVar5);
    do {
      pPixels[uVar21].field_0 =
           local_d8[(ulong)(byte)basist::g_bc7_partition3[uVar21 + (uVar4 << 4)] * 8 +
                    (ulong)auStack_78[uVar21]];
      uVar21 = uVar21 + 1;
    } while (uVar21 != 0x10);
  }
  return uVar22 == uVar7;
}

Assistant:

bool unpack_bc7_mode0_2(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
	{
		//const uint32_t SUBSETS = 3;
		const uint32_t ENDPOINTS = 6;
		const uint32_t COMPS = 3;
		const uint32_t WEIGHT_BITS = (mode == 0) ? 3 : 2;
		const uint32_t ENDPOINT_BITS = (mode == 0) ? 4 : 5;
		const uint32_t PBITS = (mode == 0) ? 6 : 0;
		const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
		uint32_t bit_offset = 0;
		const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

		if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

		const uint32_t part = read_bits32(pBuf, bit_offset, (mode == 0) ? 4 : 6);

		color_rgba endpoints[ENDPOINTS];
		for (uint32_t c = 0; c < COMPS; c++)
			for (uint32_t e = 0; e < ENDPOINTS; e++)
				endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);

		uint32_t pbits[6];
		for (uint32_t p = 0; p < PBITS; p++)
			pbits[p] = read_bits32(pBuf, bit_offset, 1);

		uint32_t weights[16];
		for (uint32_t i = 0; i < 16; i++)
			weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == basist::g_bc7_table_anchor_index_third_subset_1[part]) || (i == basist::g_bc7_table_anchor_index_third_subset_2[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);

		assert(bit_offset == 128);

		for (uint32_t e = 0; e < ENDPOINTS; e++)
			for (uint32_t c = 0; c < 4; c++)
				endpoints[e][c] = (uint8_t)((c == 3) ? 255 : (PBITS ? bc7_dequant(endpoints[e][c], pbits[e], ENDPOINT_BITS) : bc7_dequant(endpoints[e][c], ENDPOINT_BITS)));

		color_rgba block_colors[3][8];
		for (uint32_t s = 0; s < 3; s++)
			for (uint32_t i = 0; i < WEIGHT_VALS; i++)
			{
				for (uint32_t c = 0; c < 3; c++)
					block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
				block_colors[s][i][3] = 255;
			}

		for (uint32_t i = 0; i < 16; i++)
			pPixels[i] = block_colors[basist::g_bc7_partition3[part * 16 + i]][weights[i]];

		return true;
	}